

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<long_double>
          (BasicWriter<wchar_t> *this,longdouble value,FormatSpec *spec)

{
  void *__src;
  long lVar1;
  Alignment AVar2;
  wchar_t wVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CharPtr pwVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  wchar_t wVar14;
  ulong uVar15;
  BasicWriter<wchar_t> *pBVar16;
  uint uVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  wchar_t __tmp;
  undefined8 in_R9;
  CharTraits<wchar_t> *this_00;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  bool bVar24;
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  wchar_t format [10];
  char in_stack_ffffffffffffff3f;
  undefined2 in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff42;
  wchar_t local_a8;
  longdouble local_9c;
  long local_88;
  ushort uStack_80;
  undefined4 local_58;
  undefined1 local_54 [8];
  undefined4 auStack_4c [7];
  
  bVar23 = spec->type_;
  uVar11 = bVar23 - 0x41;
  if (uVar11 < 0x27) {
    if ((0x71UL >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar11 & 0x3f) & 1) == 0) goto LAB_0015ad0c;
      goto LAB_0015a748;
    }
    bVar4 = true;
  }
  else {
LAB_0015ad0c:
    if (bVar23 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff3f,
                 (char *)CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40));
    }
    bVar23 = 0x67;
LAB_0015a748:
    bVar4 = false;
  }
  uStack_80 = (ushort)((unkuint10)value >> 0x40);
  local_88 = SUB108(value,0);
  if (0.0 <= (double)value) {
    uVar11 = spec->flags_;
    local_a8 = L'+';
    if ((uVar11 & 2) == 0) {
      local_a8 = L' ';
    }
    if (NAN(value)) {
      if ((uVar11 & 1) == 0) {
        pcVar12 = " NAN";
        pcVar18 = " nan";
LAB_0015a814:
        if (bVar4) {
          pcVar18 = pcVar12;
        }
        write_str<char>(this,pcVar18 + 1,3,&spec->super_AlignSpec);
        return;
      }
      goto LAB_0015ad74;
    }
    if ((~uStack_80 & 0x7fff) != 0 || local_88 != -0x8000000000000000) {
      puVar9 = *(undefined8 **)(this + 8);
      lVar21 = puVar9[2];
      uVar17 = (spec->super_AlignSpec).super_WidthSpec.width_;
      if ((uVar11 & 1) != 0) {
        local_9c = value;
        goto LAB_0015a89e;
      }
      local_a8 = L'\0';
      bVar4 = true;
      local_9c = value;
      goto LAB_0015a8d2;
    }
    if ((uVar11 & 1) == 0) {
      pcVar12 = " INF";
      pcVar18 = " inf";
      goto LAB_0015a814;
    }
  }
  else {
    local_9c = -value;
    if (NAN(value)) {
      local_a8 = L'-';
LAB_0015ad74:
      pcVar12 = " NAN";
      pcVar18 = " nan";
      goto LAB_0015a84b;
    }
    local_a8 = L'-';
    if ((~uStack_80 & 0x7fff) != 0 || local_88 != -0x8000000000000000) {
      puVar9 = *(undefined8 **)(this + 8);
      lVar21 = puVar9[2];
      uVar17 = (spec->super_AlignSpec).super_WidthSpec.width_;
      local_a8 = L'-';
LAB_0015a89e:
      if ((ulong)puVar9[3] < (ulong)(uVar17 + (uVar17 == 0)) + lVar21) {
        (**(code **)*puVar9)(puVar9);
      }
      bVar24 = uVar17 == 0;
      uVar17 = uVar17 - 1;
      bVar4 = false;
      if (bVar24) {
        uVar17 = 0;
      }
      lVar21 = lVar21 + 1;
      uVar11 = spec->flags_;
LAB_0015a8d2:
      pBVar16 = this + 8;
      local_58 = 0x25;
      if ((uVar11 & 8) == 0) {
        puVar9 = (undefined8 *)local_54;
      }
      else {
        puVar9 = (undefined8 *)(local_54 + 4);
        local_54._0_4_ = 0x23;
      }
      AVar2 = (spec->super_AlignSpec).align_;
      if (AVar2 != ALIGN_CENTER) {
        if (AVar2 == ALIGN_LEFT) {
          *(undefined4 *)puVar9 = 0x2d;
          puVar9 = (undefined8 *)((long)puVar9 + 4);
        }
        if (uVar17 != 0) {
          *(undefined4 *)puVar9 = 0x2a;
          puVar9 = (undefined8 *)((long)puVar9 + 4);
          goto LAB_0015a920;
        }
      }
      uVar17 = 0;
LAB_0015a920:
      uVar11 = spec->precision_;
      if (-1 < (int)uVar11) {
        *puVar9 = 0x2a0000002e;
        puVar9 = puVar9 + 1;
      }
      *(undefined4 *)puVar9 = 0x4c;
      *(uint *)((long)puVar9 + 4) = (uint)bVar23;
      *(undefined4 *)(puVar9 + 1) = 0;
      wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
      do {
        this_00 = (CharTraits<wchar_t> *)(*(long *)(*(long *)pBVar16 + 8) + lVar21 * 4);
        uVar11 = internal::CharTraits<wchar_t>::format_float<long_double>
                           (this_00,(wchar_t *)(*(long *)(*(long *)pBVar16 + 0x18) - lVar21),
                            (size_t)&local_58,(wchar_t *)(ulong)uVar17,uVar11,(int)in_R9,local_9c);
        if ((int)uVar11 < 0) {
          puVar9 = *(undefined8 **)pBVar16;
          if (puVar9[3] != -1) {
            uVar19 = puVar9[3] + 1;
            puVar10 = (undefined8 *)*puVar9;
            goto LAB_0015a9d0;
          }
        }
        else {
          puVar9 = *(undefined8 **)pBVar16;
          uVar15 = puVar9[3];
          if ((ulong)uVar11 + lVar21 < uVar15) goto LAB_0015a9e5;
          uVar19 = (ulong)uVar11 + lVar21 + 1;
          if (uVar15 < uVar19) {
            puVar10 = (undefined8 *)*puVar9;
LAB_0015a9d0:
            (*(code *)*puVar10)(puVar9,uVar19);
          }
        }
        uVar11 = spec->precision_;
      } while( true );
    }
  }
  pcVar12 = " INF";
  pcVar18 = " inf";
LAB_0015a84b:
  if (bVar4) {
    pcVar18 = pcVar12;
  }
  pwVar8 = write_str<char>(this,pcVar18,4,&spec->super_AlignSpec);
  *pwVar8 = local_a8;
  return;
LAB_0015a9e5:
  AVar2 = (spec->super_AlignSpec).align_;
  if (bVar4) {
    local_a8 = L'\0';
    goto LAB_0015aa2e;
  }
  if (AVar2 == ALIGN_RIGHT) {
    iVar27 = *(int *)this_00;
joined_r0x0015aa1f:
    wVar14 = wVar3;
    if (iVar27 != 0x20) goto LAB_0015aa21;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      iVar27 = *(int *)this_00;
      goto joined_r0x0015aa1f;
    }
LAB_0015aa21:
    wVar14 = local_a8;
    local_a8 = L'\0';
  }
  *(wchar_t *)(this_00 + -4) = wVar14;
  uVar11 = uVar11 + 1;
LAB_0015aa2e:
  if (AVar2 == ALIGN_CENTER) {
    uVar17 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar11 < uVar17) {
      lVar21 = puVar9[2];
      uVar19 = lVar21 + (ulong)uVar17;
      puVar10 = puVar9;
      if (uVar15 < uVar19) {
        (**(code **)*puVar9)(puVar9,uVar19);
        puVar10 = *(undefined8 **)pBVar16;
      }
      puVar9[2] = uVar19;
      lVar13 = puVar10[1];
      __src = (void *)(lVar13 + lVar21 * 4);
      uVar22 = (ulong)uVar11;
      memmove((void *)((long)__src + (ulong)(uVar17 - uVar11 >> 1) * 4),__src,uVar22 * 4);
      auVar7 = _DAT_00167ae0;
      auVar6 = _DAT_00163520;
      auVar5 = _DAT_00163510;
      uVar17 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar15 = uVar17 - uVar22;
      uVar19 = uVar15 >> 1;
      if (1 < uVar15) {
        uVar15 = uVar19 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar15;
        auVar25._0_8_ = uVar15;
        auVar25._12_4_ = (int)(uVar15 >> 0x20);
        lVar1 = lVar13 + lVar21 * 4;
        lVar20 = 0;
        auVar25 = auVar25 ^ _DAT_00163520;
        do {
          auVar28._8_4_ = (int)lVar20;
          auVar28._0_8_ = lVar20;
          auVar28._12_4_ = (int)((ulong)lVar20 >> 0x20);
          auVar30 = (auVar28 | auVar5) ^ auVar6;
          iVar27 = auVar25._4_4_;
          if ((bool)(~(auVar30._4_4_ == iVar27 && auVar25._0_4_ < auVar30._0_4_ ||
                      iVar27 < auVar30._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar20 * 4) = wVar3;
          }
          if ((auVar30._12_4_ != auVar25._12_4_ || auVar30._8_4_ <= auVar25._8_4_) &&
              auVar30._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar20 * 4) = wVar3;
          }
          auVar28 = (auVar28 | auVar7) ^ auVar6;
          iVar31 = auVar28._4_4_;
          if (iVar31 <= iVar27 && (iVar31 != iVar27 || auVar28._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar20 * 4) = wVar3;
            *(wchar_t *)(lVar1 + 0xc + lVar20 * 4) = wVar3;
          }
          lVar20 = lVar20 + 4;
        } while ((uVar15 - ((uint)(uVar19 + 0x3fffffffffffffff) & 3)) + 4 != lVar20);
      }
      auVar7 = _DAT_00167ae0;
      auVar6 = _DAT_00163520;
      auVar5 = _DAT_00163510;
      if (uVar17 == uVar11) {
        return;
      }
      uVar15 = ((ulong)uVar17 * 4 + (uVar19 + uVar22) * -4) - 4;
      auVar30._8_4_ = (int)uVar15;
      auVar30._0_8_ = uVar15;
      auVar30._12_4_ = (int)(uVar15 >> 0x20);
      auVar26._0_8_ = uVar15 >> 2;
      auVar26._8_8_ = auVar30._8_8_ >> 2;
      lVar13 = uVar19 * 4 + lVar21 * 4 + uVar22 * 4 + lVar13;
      uVar19 = 0;
      auVar26 = auVar26 ^ _DAT_00163520;
      do {
        auVar29._8_4_ = (int)uVar19;
        auVar29._0_8_ = uVar19;
        auVar29._12_4_ = (int)(uVar19 >> 0x20);
        auVar25 = (auVar29 | auVar5) ^ auVar6;
        iVar27 = auVar26._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar27 && auVar26._0_4_ < auVar25._0_4_ ||
                    iVar27 < auVar25._4_4_) & 1)) {
          *(wchar_t *)(lVar13 + uVar19 * 4) = wVar3;
        }
        if ((auVar25._12_4_ != auVar26._12_4_ || auVar25._8_4_ <= auVar26._8_4_) &&
            auVar25._12_4_ <= auVar26._12_4_) {
          *(wchar_t *)(lVar13 + 4 + uVar19 * 4) = wVar3;
        }
        auVar25 = (auVar29 | auVar7) ^ auVar6;
        iVar31 = auVar25._4_4_;
        if (iVar31 <= iVar27 && (iVar31 != iVar27 || auVar25._0_4_ <= auVar26._0_4_)) {
          *(wchar_t *)(lVar13 + 8 + uVar19 * 4) = wVar3;
          *(wchar_t *)(lVar13 + 0xc + uVar19 * 4) = wVar3;
        }
        uVar19 = uVar19 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar19);
      return;
    }
  }
  if (((char)local_a8 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    wVar14 = *(wchar_t *)this_00;
    while (wVar14 == L' ') {
      *(wchar_t *)this_00 = wVar3;
      wVar14 = *(wchar_t *)(this_00 + 4);
      this_00 = this_00 + 4;
    }
    if ((char)local_a8 != '\0') {
      *(wchar_t *)(this_00 + -4) = local_a8;
    }
  }
  uVar19 = (ulong)uVar11 + puVar9[2];
  if (uVar15 < uVar19) {
    (**(code **)*puVar9)(puVar9,uVar19);
  }
  puVar9[2] = uVar19;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}